

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int compare_socket_address(sockaddr *x,sockaddr *y)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  sockaddr_in6 *yin6;
  sockaddr_in6 *xin6;
  bool bVar6;
  
  uVar2 = x->sa_family;
  if (uVar2 != y->sa_family) {
    bVar6 = uVar2 < y->sa_family;
    goto LAB_0011c6ce;
  }
  if (uVar2 == 0) {
    return 1;
  }
  if (uVar2 == 10) {
    iVar1 = memcmp(x->sa_data + 6,y->sa_data + 6,0x10);
    if (iVar1 != 0) {
      return iVar1;
    }
    uVar2 = *(ushort *)x->sa_data;
    uVar4 = *(ushort *)y->sa_data;
    if (uVar2 == uVar4) {
      uVar3 = *(uint *)(x->sa_data + 2);
      uVar5 = *(uint *)(y->sa_data + 2);
      if (uVar3 == uVar5) {
        uVar3 = *(uint *)(x[1].sa_data + 6);
        uVar5 = *(uint *)(y[1].sa_data + 6);
        if (uVar3 == uVar5) {
          return 0;
        }
      }
      goto LAB_0011c71e;
    }
  }
  else {
    if (uVar2 != 2) {
      __assert_fail("!\"unknown sa_family\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x13f3,"int compare_socket_address(struct sockaddr *, struct sockaddr *)");
    }
    uVar3 = *(uint *)(x->sa_data + 2);
    uVar5 = *(uint *)(y->sa_data + 2);
    if (uVar3 != uVar5) {
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
LAB_0011c71e:
      bVar6 = uVar3 < uVar5;
      goto LAB_0011c6ce;
    }
    uVar2 = *(ushort *)x->sa_data;
    uVar4 = *(ushort *)y->sa_data;
    if (uVar2 == uVar4) {
      return 0;
    }
  }
  bVar6 = (ushort)(uVar2 << 8 | uVar2 >> 8) < (ushort)(uVar4 << 8 | uVar4 >> 8);
LAB_0011c6ce:
  return -(uint)bVar6 | 1;
}

Assistant:

static int compare_socket_address(struct sockaddr *x, struct sockaddr *y)
{
#define CMP(a, b)                                                                                                                  \
    if (a != b)                                                                                                                    \
    return a < b ? -1 : 1

    CMP(x->sa_family, y->sa_family);

    if (x->sa_family == AF_INET) {
        struct sockaddr_in *xin = (void *)x, *yin = (void *)y;
        CMP(ntohl(xin->sin_addr.s_addr), ntohl(yin->sin_addr.s_addr));
        CMP(ntohs(xin->sin_port), ntohs(yin->sin_port));
    } else if (x->sa_family == AF_INET6) {
        struct sockaddr_in6 *xin6 = (void *)x, *yin6 = (void *)y;
        int r = memcmp(xin6->sin6_addr.s6_addr, yin6->sin6_addr.s6_addr, sizeof(xin6->sin6_addr.s6_addr));
        if (r != 0)
            return r;
        CMP(ntohs(xin6->sin6_port), ntohs(yin6->sin6_port));
        CMP(xin6->sin6_flowinfo, yin6->sin6_flowinfo);
        CMP(xin6->sin6_scope_id, yin6->sin6_scope_id);
    } else if (x->sa_family == AF_UNSPEC) {
        return 1;
    } else {
        assert(!"unknown sa_family");
    }

#undef CMP
    return 0;
}